

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void ResetAllMBInfo(VP8Encoder *enc)

{
  WebPPicture *in_RDI;
  int n;
  int *in_stack_ffffffffffffffe8;
  int percent;
  
  for (percent = 0; percent < *(int *)&in_RDI->a * *(int *)((long)&in_RDI->a + 4);
      percent = percent + 1) {
    DefaultMBInfo((VP8MBInfo *)(in_RDI[0x5c].writer + (long)percent * 4));
  }
  in_RDI[5].use_argb = 0;
  in_RDI[5].colorspace = WEBP_YUV420;
  in_RDI[0xe].colorspace = WEBP_YUV420;
  in_RDI[0xe].width = 0;
  WebPReportProgress(in_RDI,percent,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void ResetAllMBInfo(VP8Encoder* const enc) {
  int n;
  for (n = 0; n < enc->mb_w * enc->mb_h; ++n) {
    DefaultMBInfo(&enc->mb_info[n]);
  }
  // Default susceptibilities.
  enc->dqm[0].alpha = 0;
  enc->dqm[0].beta = 0;
  // Note: we can't compute this 'alpha' / 'uv_alpha' -> set to default value.
  enc->alpha = 0;
  enc->uv_alpha = 0;
  WebPReportProgress(enc->pic, enc->percent + 20, &enc->percent);
}